

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_io.cc
# Opt level: O0

StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> *
draco::ReadPointCloudFromFile(string *file_name)

{
  bool bVar1;
  undefined1 uVar2;
  ulong uVar3;
  unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *value;
  string *in_RSI;
  StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> *in_RDI;
  StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> status_or;
  Decoder decoder;
  DecoderBuffer decoder_buffer;
  vector<char,_std::allocator<char>_> buffer;
  Status _local_status;
  PlyDecoder ply_decoder;
  Status obj_status;
  ObjDecoder obj_decoder;
  string extension;
  unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> pc;
  pointer in_stack_fffffffffffffc08;
  ObjDecoder *in_stack_fffffffffffffc10;
  PointCloud *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  ObjDecoder *in_stack_fffffffffffffc40;
  undefined6 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  undefined8 in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  _Head_base<0UL,_draco::PointCloud_*,_false> in_stack_fffffffffffffca8;
  allocator<char> local_2b1;
  string local_2b0 [72];
  vector<char,_std::allocator<char>_> local_268;
  DecoderBuffer *in_stack_fffffffffffffdb0;
  Decoder *in_stack_fffffffffffffdb8;
  Status local_1d8 [9];
  string local_68 [32];
  string local_48 [56];
  string *local_10;
  
  local_10 = in_RSI;
  operator_new(0xa8);
  PointCloud::PointCloud(in_stack_fffffffffffffc20);
  std::unique_ptr<draco::PointCloud,std::default_delete<draco::PointCloud>>::
  unique_ptr<std::default_delete<draco::PointCloud>,void>
            ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
             in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < 4) {
    std::__cxx11::string::string(local_68,local_10);
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_68,(ulong)local_10);
  }
  parser::ToLower((string *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
  std::__cxx11::string::~string(local_68);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08);
  if (bVar1) {
    ObjDecoder::ObjDecoder(in_stack_fffffffffffffc40);
    std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::get
              ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
               in_stack_fffffffffffffc10);
    ObjDecoder::DecodeFromFile
              ((ObjDecoder *)in_stack_fffffffffffffca8._M_head_impl,
               (string *)in_stack_fffffffffffffca0,(PointCloud *)in_stack_fffffffffffffc98);
    bVar1 = Status::ok(local_1d8);
    if (bVar1) {
      StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
      StatusOr((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                *)in_stack_fffffffffffffc10,
               (unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
               in_stack_fffffffffffffc08);
    }
    else {
      StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
      StatusOr((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                *)in_stack_fffffffffffffc10,(Status *)in_stack_fffffffffffffc08);
    }
    Status::~Status((Status *)0x14fee1);
    ObjDecoder::~ObjDecoder(in_stack_fffffffffffffc10);
  }
  else {
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08);
    if ((bool)uVar2) {
      PlyDecoder::PlyDecoder((PlyDecoder *)in_stack_fffffffffffffc10);
      std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::get
                ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                 in_stack_fffffffffffffc10);
      PlyDecoder::DecodeFromFile
                ((PlyDecoder *)in_stack_fffffffffffffca8._M_head_impl,
                 (string *)in_stack_fffffffffffffca0,(PointCloud *)in_stack_fffffffffffffc98);
      bVar1 = Status::ok((Status *)&stack0xfffffffffffffdb0);
      if (!bVar1) {
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        StatusOr((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                  *)in_stack_fffffffffffffc10,(Status *)in_stack_fffffffffffffc08);
      }
      Status::~Status((Status *)0x150003);
      if (bVar1) {
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        StatusOr((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                  *)in_stack_fffffffffffffc10,
                 (unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
                 in_stack_fffffffffffffc08);
      }
      PlyDecoder::~PlyDecoder((PlyDecoder *)0x15003c);
    }
    else {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)0x150065);
      bVar1 = ReadFileToBuffer(in_stack_fffffffffffffc28,
                               (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc20);
      if (bVar1) {
        DecoderBuffer::DecoderBuffer((DecoderBuffer *)in_stack_fffffffffffffc10);
        in_stack_fffffffffffffc20 =
             (PointCloud *)
             std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1501c5);
        std::vector<char,_std::allocator<char>_>::size(&local_268);
        DecoderBuffer::Init((DecoderBuffer *)in_stack_fffffffffffffc10,
                            (char *)in_stack_fffffffffffffc08,0x1501e9);
        in_stack_fffffffffffffc10 = (ObjDecoder *)&stack0xfffffffffffffcb0;
        Decoder::Decoder((Decoder *)0x1501fd);
        Decoder::DecodePointCloudFromBuffer(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        value = StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                ::value((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                         *)&stack0xfffffffffffffc80);
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        StatusOr((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                  *)in_stack_fffffffffffffc10,value);
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        ~StatusOr((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                   *)in_stack_fffffffffffffc10);
        Decoder::~Decoder((Decoder *)0x150258);
        DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x150265);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc50,
                   (char *)CONCAT17(in_stack_fffffffffffffc4f,
                                    CONCAT16(uVar2,in_stack_fffffffffffffc48)),
                   (allocator<char> *)in_stack_fffffffffffffc40);
        Status::Status((Status *)in_stack_fffffffffffffc10,
                       (Code)((ulong)in_stack_fffffffffffffc08 >> 0x20),(string *)0x1500d2);
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        StatusOr((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                  *)in_stack_fffffffffffffc10,(Status *)in_stack_fffffffffffffc08);
        Status::~Status((Status *)0x1500f5);
        std::__cxx11::string::~string(local_2b0);
        std::allocator<char>::~allocator(&local_2b1);
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc20);
    }
  }
  std::__cxx11::string::~string(local_48);
  std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>::~unique_ptr
            ((unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_> *)
             in_stack_fffffffffffffc10);
  return in_RDI;
}

Assistant:

StatusOr<std::unique_ptr<PointCloud>> ReadPointCloudFromFile(
    const std::string &file_name) {
  std::unique_ptr<PointCloud> pc(new PointCloud());
  // Analyze file extension.
  const std::string extension = parser::ToLower(
      file_name.size() >= 4 ? file_name.substr(file_name.size() - 4)
                            : file_name);
  if (extension == ".obj") {
    // Wavefront OBJ file format.
    ObjDecoder obj_decoder;
    const Status obj_status = obj_decoder.DecodeFromFile(file_name, pc.get());
    if (!obj_status.ok()) {
      return obj_status;
    }
    return std::move(pc);
  }
  if (extension == ".ply") {
    // Wavefront PLY file format.
    PlyDecoder ply_decoder;
    DRACO_RETURN_IF_ERROR(ply_decoder.DecodeFromFile(file_name, pc.get()));
    return std::move(pc);
  }

  std::vector<char> buffer;
  if (!ReadFileToBuffer(file_name, &buffer)) {
    return Status(Status::DRACO_ERROR, "Unable to read input file.");
  }
  DecoderBuffer decoder_buffer;
  decoder_buffer.Init(buffer.data(), buffer.size());
  Decoder decoder;
  auto status_or = decoder.DecodePointCloudFromBuffer(&decoder_buffer);
  return std::move(status_or).value();
}